

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O3

void __thiscall
QToolBarAreaLayout::insertItem(QToolBarAreaLayout *this,DockPosition pos,QLayoutItem *item)

{
  iterator iVar1;
  QToolBarAreaLayoutInfo *this_00;
  long in_FS_OFFSET;
  undefined1 local_58 [24];
  QArrayData *local_40;
  QToolBarAreaLayoutItem *pQStack_38;
  qsizetype local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->docks + pos;
  if (this->docks[pos].lines.d.size == 0) {
    local_58._16_4_ = this->docks[pos].o;
    local_58._0_8_ = (QLayoutItem *)0x0;
    local_58._8_4_ = -1;
    local_58._12_4_ = -1;
    local_40 = (QArrayData *)0x0;
    pQStack_38 = (QToolBarAreaLayoutItem *)0x0;
    local_30 = 0;
    QtPrivate::QMovableArrayOps<QToolBarAreaLayoutLine>::emplace<QToolBarAreaLayoutLine>
              ((QMovableArrayOps<QToolBarAreaLayoutLine> *)this_00,0,
               (QToolBarAreaLayoutLine *)local_58);
    QList<QToolBarAreaLayoutLine>::end(&this_00->lines);
    if (local_40 != (QArrayData *)0x0) {
      LOCK();
      (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40,0x18,0x10);
      }
    }
  }
  iVar1 = QList<QToolBarAreaLayoutLine>::end(&this_00->lines);
  local_58._8_4_ = 0;
  local_58._12_4_ = -1;
  local_58._16_4_ = 0xffffffff;
  local_58[0x14] = false;
  local_58._0_8_ = item;
  QtPrivate::QPodArrayOps<QToolBarAreaLayoutItem>::emplace<QToolBarAreaLayoutItem>
            ((QPodArrayOps<QToolBarAreaLayoutItem> *)&iVar1.i[-1].toolBarItems,
             iVar1.i[-1].toolBarItems.d.size,(QToolBarAreaLayoutItem *)local_58);
  QList<QToolBarAreaLayoutItem>::end(&iVar1.i[-1].toolBarItems);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarAreaLayout::insertItem(QInternal::DockPosition pos, QLayoutItem *item)
{
    if (docks[pos].lines.isEmpty())
        docks[pos].lines.append(QToolBarAreaLayoutLine(docks[pos].o));
    docks[pos].lines.last().toolBarItems.append(item);
}